

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O0

uint32_t write8(FileStream *out,uint8_t byte,uint32_t column)

{
  bool bVar1;
  uint local_20;
  char local_1c [4];
  int i;
  char s [4];
  uint32_t column_local;
  uint8_t byte_local;
  FileStream *out_local;
  
  bVar1 = 99 < byte;
  s[3] = byte;
  if (bVar1) {
    local_1c[0] = byte / 100 + 0x30;
    s[3] = byte % 100;
  }
  local_20 = (uint)bVar1;
  if ((bVar1) || (9 < (byte)s[3])) {
    local_1c[(int)local_20] = (byte)s[3] / 10 + 0x30;
    s[3] = (byte)s[3] % 10;
    local_20 = local_20 + 1;
  }
  local_1c[(int)local_20] = s[3] + '0';
  local_1c[(int)(local_20 + 1)] = '\0';
  if (column == 0xffffffff) {
    i = 1;
  }
  else {
    i = column;
    if (column < 0x10) {
      T_FileStream_writeLine(out,",");
      i = i + 1;
    }
    else {
      T_FileStream_writeLine(out,",\n");
      i = 1;
    }
  }
  T_FileStream_writeLine(out,local_1c);
  return i;
}

Assistant:

static uint32_t
write8(FileStream *out, uint8_t byte, uint32_t column) {
    char s[4];
    int i=0;

    /* convert the byte value to a string */
    if(byte>=100) {
        s[i++]=(char)('0'+byte/100);
        byte%=100;
    }
    if(i>0 || byte>=10) {
        s[i++]=(char)('0'+byte/10);
        byte%=10;
    }
    s[i++]=(char)('0'+byte);
    s[i]=0;

    /* write the value, possibly with comma and newline */
    if(column==MAX_COLUMN) {
        /* first byte */
        column=1;
    } else if(column<16) {
        T_FileStream_writeLine(out, ",");
        ++column;
    } else {
        T_FileStream_writeLine(out, ",\n");
        column=1;
    }
    T_FileStream_writeLine(out, s);
    return column;
}